

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.hpp
# Opt level: O0

bool boost::spirit::karma::
     any_binary_generator<boost::spirit::karma::detail::integer<16>,(boost::spirit::endian::endianness)0,16>
     ::
     generate<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type,unsigned_short>
               (output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>
                *sink,unused_type *context,unused_type *d,unsigned_short *attr)

{
  bool bVar1;
  type puVar2;
  uint local_44;
  uchar *puStack_40;
  uint i;
  uchar *bytes;
  unsigned_short *puStack_30;
  endian<(boost::spirit::endian::endianness)0,_unsigned_short,_16UL,_(boost::spirit::endian::alignment)0>
  p;
  unsigned_short *attr_local;
  unused_type *d_local;
  unused_type *context_local;
  output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>
  *sink_local;
  
  puStack_30 = attr;
  bVar1 = traits::has_optional_value<unsigned_short>(attr);
  if (bVar1) {
    puVar2 = traits::extract_from<unsigned_short,unsigned_short,boost::spirit::unused_type_const>
                       (puStack_30,context);
    endian::
    endian<(boost::spirit::endian::endianness)0,_unsigned_short,_16UL,_(boost::spirit::endian::alignment)0>
    ::operator=((endian<(boost::spirit::endian::endianness)0,_unsigned_short,_16UL,_(boost::spirit::endian::alignment)0>
                 *)((long)&bytes + 6),*puVar2);
    puStack_40 = (uchar *)((long)&bytes + 6);
    for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
      bVar1 = detail::
              generate_to<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>,unsigned_char>
                        (sink,puStack_40);
      if (!bVar1) {
        return false;
      }
      puStack_40 = puStack_40 + 1;
    }
    sink_local._7_1_ =
         delimit_out<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>>
                   (sink);
  }
  else {
    sink_local._7_1_ = false;
  }
  return sink_local._7_1_;
}

Assistant:

static bool generate(OutputIterator& sink, Context& context
          , Delimiter const& d, Attribute const& attr)
        {
            if (!traits::has_optional_value(attr))
                return false;

            // Even if the endian types are not pod's (at least not in the
            // definition of C++03) it seems to be safe to assume they are.
            // This allows us to treat them as a sequence of consecutive bytes.
            boost::endian::endian<endian, typename T::type, bits> p;

#if defined(BOOST_MSVC)
// warning C4244: 'argument' : conversion from 'const int' to 'foo', possible loss of data
#pragma warning(push)
#pragma warning(disable: 4244)
#endif
            typedef typename T::type attribute_type;
            p = traits::extract_from<attribute_type>(attr, context);
#if defined(BOOST_MSVC)
#pragma warning(pop)
#endif

            unsigned char const* bytes =
                reinterpret_cast<unsigned char const*>(&p);

            for (unsigned int i = 0; i < sizeof(p); ++i)
            {
                if (!detail::generate_to(sink, *bytes++))
                    return false;
            }
            return karma::delimit_out(sink, d);     // always do post-delimiting
        }